

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseFunctionName(ParserImpl *this)

{
  undefined4 uVar1;
  TokenDetail *pTVar2;
  undefined8 uVar3;
  pointer pFVar4;
  TokenDetail *in_RSI;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  ParseException *unaff_retaddr;
  unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> func_name;
  pointer in_stack_ffffffffffffff78;
  ParserImpl *in_stack_ffffffffffffff80;
  value_type *in_stack_ffffffffffffff88;
  FunctionName *in_stack_ffffffffffffff90;
  TokenDetail *t;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> str;
  
  t = in_RSI;
  str._M_head_impl =
       (SyntaxTree *)
       in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  pTVar2 = NextToken(in_stack_ffffffffffffff80);
  if (pTVar2->token_ != 0x115) {
    uVar3 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException(unaff_retaddr,(char *)str._M_head_impl,t);
    __cxa_throw(uVar3,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  operator_new(0x48);
  luna::FunctionName::FunctionName(in_stack_ffffffffffffff90);
  std::unique_ptr<luna::FunctionName,std::default_delete<luna::FunctionName>>::
  unique_ptr<std::default_delete<luna::FunctionName>,void>
            ((unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_>::operator->
            ((unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> *)0x1dba94);
  std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
            ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  while( true ) {
    pTVar2 = LookAhead(in_stack_ffffffffffffff80);
    if (pTVar2->token_ != 0x2e) {
      pTVar2 = LookAhead(in_stack_ffffffffffffff80);
      if (pTVar2->token_ == 0x3a) {
        NextToken(in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff80 = (ParserImpl *)NextToken(in_stack_ffffffffffffff80);
        if ((in_stack_ffffffffffffff80->current_).line_ != 0x115) {
          uVar3 = __cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(unaff_retaddr,(char *)str._M_head_impl,t);
          __cxa_throw(uVar3,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
        }
        pFVar4 = std::unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_>::
                 operator->((unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_>
                             *)0x1dbc6d);
        (pFVar4->member_name_).field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)in_RSI->module_;
        (pFVar4->member_name_).module_ = *(String **)&in_RSI->line_;
        uVar1 = *(undefined4 *)&in_RSI->field_0x1c;
        (pFVar4->member_name_).line_ = in_RSI->token_;
        (pFVar4->member_name_).column_ = uVar1;
        (pFVar4->member_name_).token_ = *(int *)&in_RSI[1].field_0;
      }
      std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
      unique_ptr<luna::FunctionName,std::default_delete<luna::FunctionName>,void>
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff90,
                 (unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> *)pTVar2)
      ;
      std::unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_>::~unique_ptr
                ((unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> *)
                 in_stack_ffffffffffffff80);
      return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             in_RDI.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    }
    NextToken(in_stack_ffffffffffffff80);
    pTVar2 = NextToken(in_stack_ffffffffffffff80);
    if (pTVar2->token_ != 0x115) break;
    std::unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_>::operator->
              ((unique_ptr<luna::FunctionName,_std::default_delete<luna::FunctionName>_> *)0x1dbb9c)
    ;
    std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
              ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  uVar3 = __cxa_allocate_exception(0x20);
  luna::ParseException::ParseException(unaff_retaddr,(char *)str._M_head_impl,t);
  __cxa_throw(uVar3,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionName()
        {
            if (NextToken().token_ != Token_Id)
                throw ParseException("unexpect token after 'function'", current_);

            std::unique_ptr<FunctionName> func_name(new FunctionName);
            func_name->names_.push_back(current_);

            while (LookAhead().token_ == '.')
            {
                NextToken();            // skip '.'
                if (NextToken().token_ != Token_Id)
                    throw ParseException("unexpect token in function name after '.'", current_);
                func_name->names_.push_back(current_);
            }

            if (LookAhead().token_ == ':')
            {
                NextToken();            // skip ':'
                if (NextToken().token_ != Token_Id)
                    throw ParseException("unexpect token in function name after ':'", current_);
                func_name->member_name_ = current_;
            }

            return std::move(func_name);
        }